

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sDrawTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Stress::DrawTests::init(DrawTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestCaseGroup *pTVar1;
  DrawMethod method;
  DrawMethod method_00;
  string desc;
  string name;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_data","Test with unaligned data");
  tcu::TestNode::addChild((TestNode *)this,node);
  deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_(&name,(DrawTestSpec *)0x3,method);
  deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_(&desc,(DrawTestSpec *)0x3,method_00);
  pTVar1 = (TestCaseGroup *)operator_new(0x80);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
             desc._M_dataplus._M_p);
  (pTVar1->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e285b0;
  *(undefined4 *)&pTVar1[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = 3;
  tcu::TestNode::addChild(node,(TestNode *)pTVar1);
  std::__cxx11::string::~string((string *)&desc);
  std::__cxx11::string::~string((string *)&name);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_context,"random","random draw commands.");
  (pTVar1->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e28650;
  tcu::TestNode::addChild(node,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_data", "Test with unaligned data");

	addChild(unalignedGroup);

	// .unaligned_data
	{
		const gls::DrawTestSpec::DrawMethod basicMethods[] =
		{
			// gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
			gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
		{
			std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
			std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

			unalignedGroup->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
		}

		// Random

		unalignedGroup->addChild(new RandomGroup(m_context, "random", "random draw commands."));
	}

}